

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_partials_9(void)

{
  run("standalone tags should not require a newline to follow them",">\n  {{>partial}}","{}",
      "{\"partial\": \">\\n>\"}",">\n  >\n  >");
  return;
}

Assistant:

static void
test_partials_9(void)
{
    run(
        "standalone tags should not require a newline to follow them",
        ">\n  {{>partial}}",
        "{}",
        "{\"partial\": \">\\n>\"}",
        ">\n  >\n  >"
    );
}